

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O1

int __thiscall
FormatTypeSCP::LoadDisk
          (FormatTypeSCP *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  IDisk *this_00;
  MFMTrack *pMVar8;
  long lVar9;
  FormatTypeSCP *pFVar10;
  ulong *puVar11;
  uchar *bitfield;
  undefined8 *puVar12;
  void *__s;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  FormatTypeSCP *this_01;
  int duration;
  int iVar17;
  ulong in_R10;
  long lVar18;
  long lVar19;
  int side;
  long *plVar20;
  bool bVar21;
  bool bVar22;
  
  iVar17 = -1;
  if (buffer[2] == 'P' && *(short *)buffer == 0x4353) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[5];
    bVar2 = buffer[7];
    bVar21 = 0x2a < bVar2;
    this_00->nb_sides_ = bVar21 + '\x01';
    uVar7 = (bVar2 >> bVar21) + 1;
    uVar14 = (ulong)(uVar7 * 0x20);
    lVar18 = 0;
    do {
      this_00->side_[lVar18].nb_tracks = uVar7;
      pMVar8 = (MFMTrack *)operator_new__(uVar14);
      this_00->side_[lVar18].tracks = pMVar8;
      memset(pMVar8,0,uVar14);
      lVar9 = 0;
      do {
        *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar9) = 1;
        lVar9 = lVar9 + 0x20;
      } while ((ulong)(bVar2 >> bVar21) * 0x20 + 0x20 != lVar9);
      lVar18 = lVar18 + 1;
    } while (lVar18 != (ulong)bVar21 + 1);
    pFVar10 = (FormatTypeSCP *)((ulong)bVar1 * 0x30 + 8);
    lVar18 = (ulong)((uint)bVar1 * 4) * 3;
    uVar14 = 0;
    bVar22 = false;
    lVar9 = lVar18;
    do {
      uVar16 = (ulong)*(uint *)(buffer + uVar14 * 4 + 0x10);
      this->tracks_header_[uVar14].offset = *(uint *)(buffer + uVar14 * 4 + 0x10);
      iVar17 = (int)in_R10;
      if (uVar16 != 0) {
        if (buffer[uVar16 + 2] == 'K' && *(short *)(buffer + uVar16) == 0x5254) {
          if (bVar2 < 0x2b) {
            uVar7 = 0;
          }
          else {
            uVar7 = buffer[uVar16 + 3] & 1;
          }
          bVar6 = buffer[uVar16 + 3] >> (0x2a < bVar2);
          uVar15 = 0xffffffff;
          uVar3 = *(uint *)((long)&this_00->side_[0].nb_tracks + (ulong)(uVar7 << 4));
          bVar5 = bVar6 < uVar3;
          if (bVar6 < uVar3) {
            lVar19 = *(long *)((long)&this_00->side_[0].tracks + (ulong)(uVar7 << 4));
            *(uint *)(lVar19 + 8 + (ulong)bVar6 * 0x20) = (uint)bVar1;
            this_01 = pFVar10;
            puVar11 = (ulong *)operator_new__((ulong)pFVar10);
            *puVar11 = (ulong)bVar1;
            if (bVar1 != 0) {
              lVar13 = 0;
              do {
                puVar12 = (undefined8 *)((long)puVar11 + lVar13 + 0x18);
                *puVar12 = 0;
                puVar12[1] = 0;
                *(undefined8 *)((long)puVar11 + lVar13 + 0x28) = 0;
                lVar13 = lVar13 + 0x30;
              } while ((ulong)bVar1 * 0x30 != lVar13);
            }
            *(ulong **)(lVar19 + (ulong)bVar6 * 0x20) = puVar11 + 1;
            bVar5 = true;
            if (bVar1 == 0) {
              uVar15 = in_R10 & 0xffffffff;
            }
            else {
              plVar20 = (long *)(lVar19 + (ulong)bVar6 * 0x20);
              lVar19 = 0;
              do {
                iVar17 = *(int *)(buffer + lVar19 + uVar16 + 8);
                iVar4 = *(int *)(buffer + lVar19 + uVar16 + 0xc);
                this->rpm_correction_ =
                     (double)(*(int *)(buffer + lVar19 + uVar16 + 4) / 40000) / 200.0;
                duration = (int)lVar9;
                uVar7 = ComputeTrack(this_01,(uchar *)0x0,buffer + (long)iVar4 + uVar16,iVar17,
                                     duration);
                *(uint *)(*plVar20 + 8 + lVar19 * 4) = uVar7;
                this_01 = (FormatTypeSCP *)(ulong)uVar7;
                bitfield = (uchar *)operator_new__((ulong)this_01);
                *(uchar **)(*plVar20 + lVar19 * 4) = bitfield;
                uVar7 = ComputeTrack(this_01,bitfield,buffer + (long)iVar4 + uVar16,iVar17,duration)
                ;
                *(uint *)(*plVar20 + 8 + lVar19 * 4) = uVar7;
                lVar19 = lVar19 + 0xc;
                lVar9 = lVar18;
              } while (lVar18 != lVar19);
              uVar15 = in_R10 & 0xffffffff;
              bVar5 = true;
            }
          }
        }
        else {
          bVar5 = false;
          uVar15 = 0xfffffffd;
        }
        iVar17 = (int)uVar15;
        in_R10 = uVar15;
        if (!bVar5) break;
      }
      bVar22 = 0xa4 < uVar14;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 0xa6);
    if (bVar22) {
      lVar18 = 0;
      do {
        uVar7 = this_00->side_[lVar18].nb_tracks;
        lVar9 = 0;
        do {
          if ((ulong)uVar7 << 5 == lVar9) break;
          pMVar8 = this_00->side_[lVar18].tracks;
          if (*(long *)((long)&pMVar8->revolution + lVar9) == 0) {
            *(undefined4 *)((long)&pMVar8->nb_revolutions + lVar9) = 1;
            puVar12 = (undefined8 *)operator_new__(0x38);
            *puVar12 = 1;
            puVar12[3] = 0;
            puVar12[4] = 0;
            puVar12[5] = 0;
            *(undefined8 **)((long)&pMVar8->revolution + lVar9) = puVar12 + 1;
            __s = operator_new__(100000);
            puVar12 = *(undefined8 **)((long)&pMVar8->revolution + lVar9);
            *puVar12 = __s;
            *(undefined4 *)(puVar12 + 1) = 100000;
            memset(__s,0,100000);
          }
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0x560);
        lVar18 = lVar18 + 1;
      } while (lVar18 != (ulong)bVar21 + 1);
      *created_disk = this_00;
      if (bVar22) {
        (*this_00->_vptr_IDisk[0x14])();
        iVar17 = 0;
      }
    }
  }
  return iVar17;
}

Assistant:

int FormatTypeSCP::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   unsigned char version, diskType, numRevolution;
   unsigned char startTrack, endTrack, flags;
   unsigned int check_sum_computed = 0;
   const unsigned char* header = buffer;

   if (memcmp(header, "SCP", 3) == 0)
   {
      IDisk* new_disk = new IDisk();

      version = header[3];
      diskType = header[4];
      numRevolution = header[5];
      startTrack = header[6];
      endTrack = header[7];
      flags = header[8];
      unsigned char width = header[9];
      unsigned char nb_heads = header[0x0A];
      unsigned int checkSum = *((unsigned int*)(&header[0x0C]));

      // Check the checksum !
      for (unsigned int crc = 0x10; crc < size; crc++)
      {
         check_sum_computed += header[crc];
      }
      // Compare :
      if (check_sum_computed != checkSum)
      {
         // Something to do ?
         int dbg = 1;
      }


      // Number of side :
      new_disk->nb_sides_ = (endTrack > 42) ? 2 : 1;
      int nbtracks = ((new_disk->nb_sides_ == 1) ? (endTrack) : (endTrack) / 2) + 1;
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = nbtracks;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[nbtracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * nbtracks);
         for (int tr = 0; tr < nbtracks; tr++)
         {
            new_disk->side_[side].tracks[tr].nb_revolutions = 1;
         }
      }

      // Track data header
      for (int i = 0; i < 166; i++)
      {
         tracks_header_[i].offset = *((unsigned int*)(&header[0x10 + i * 4]));

         if (tracks_header_[i].offset != 0)
         {
            const unsigned char* track_buffer = &header[tracks_header_[i].offset];
            // Check the TRK
            if (memcmp(&track_buffer[0], "TRK", 3) != 0)
            {
               // Error : No valid SCP file
               return -3;
            }

            // Track number
            int side = (new_disk->nb_sides_ == 1) ? 0 : (track_buffer[0x03] & 0x1);
            unsigned int track = (new_disk->nb_sides_ == 1) ? track_buffer[0x03] : (track_buffer[0x03] >> 1);

            if (track >= new_disk->side_[side].nb_tracks)
            {
               // TODO : Do Something here !
               int dbg = 1;
               return -1;
            }

            // Revolutions
            new_disk->side_[side].tracks[track].nb_revolutions = numRevolution;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[numRevolution];

            for (int revolution = 0; revolution < numRevolution; revolution++)
            {
               //
               int duration = *((unsigned int*)(&track_buffer[0x04 + revolution * 12]));
               int length = *((unsigned int*)(&track_buffer[0x08 + revolution * 12]));
               int offset = *((unsigned int*)(&track_buffer[0x0C + revolution * 12]));

               //timeElapsed / ick * 1000;
               rpm_correction_ = (duration * 25 / 1000000) / 200.0;

               // Read the whole bitcells
               const unsigned char* cellbuffer = &track_buffer[offset];

               // Comute size in term of bits
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  NULL, cellbuffer, length, duration);

               // Fill the bitfield
               new_disk->side_[side].tracks[track].revolution[revolution].bitfield = new unsigned char[new_disk->side_[
                  side].tracks[track].revolution[revolution].size];
               new_disk->side_[side].tracks[track].revolution[revolution].size = ComputeTrack(
                  new_disk->side_[side].tracks[track].revolution[revolution].bitfield, cellbuffer, length, duration);
            }

            //AdjustLength ( m_Disk[side].Tracks[track].Revolution, numRevolution);

            if (track == 0)
            {
               //DumpTrack (0, 0, 0);
            }
         }
      }
      // Adjust missing tracks :
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (int track = 0; track < 43 && track < new_disk->side_[side].nb_tracks; track++)
         {
            if (new_disk->side_[side].tracks[track].revolution == NULL)
            {
               // Fill this revolution with random datas
               new_disk->side_[side].tracks[track].nb_revolutions = 1;
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[6250 * 16];
               new_disk->side_[side].tracks[track].revolution[0].size = 6250 * 16;
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, 6250 * 16);
            }
         }
      }
      created_disk = new_disk;
   }
   else
   {
      // Erreur : Not a DSK file !
      return FILE_ERROR;
   }

   created_disk->CreateTrackFromMultiRevolutions();

   return OK;
}